

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O1

void CreateBackwardReferencesDH6
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  uint8_t *puVar1;
  long *plVar2;
  uint32_t *puVar3;
  ushort uVar4;
  undefined4 uVar5;
  size_t sVar6;
  size_t sVar7;
  uint32_t *puVar8;
  uint32_t *puVar9;
  BrotliEncoderDictionary *pBVar10;
  uint64_t uVar11;
  ulong uVar12;
  HasherCommon *pHVar13;
  size_t sVar14;
  PreparedDictionary *pPVar15;
  BrotliDictionary *pBVar16;
  undefined8 uVar17;
  bool bVar18;
  ulong uVar19;
  int iVar20;
  byte bVar21;
  uint32_t uVar22;
  uint32_t *puVar23;
  uint8_t *puVar24;
  uint32_t *puVar25;
  ulong *puVar26;
  size_t sVar27;
  ulong *puVar28;
  undefined8 *puVar29;
  undefined8 *puVar30;
  uint8_t *puVar31;
  byte bVar32;
  long lVar33;
  uint32_t *puVar34;
  ulong uVar35;
  ulong *puVar36;
  ulong uVar37;
  uint8_t *puVar38;
  uint uVar39;
  int iVar40;
  long lVar41;
  uint8_t *puVar42;
  uint32_t *puVar43;
  uint32_t *puVar44;
  uint *puVar45;
  undefined1 *puVar46;
  uint8_t *puVar47;
  uint16_t uVar48;
  int iVar49;
  ulong *puVar50;
  Command *pCVar51;
  Command *pCVar52;
  undefined8 *puVar53;
  byte bVar54;
  ulong *puVar55;
  uint32_t *puVar56;
  int iVar57;
  ulong uVar58;
  long lVar59;
  long lVar60;
  uint8_t *puVar61;
  uint8_t *puVar62;
  uint32_t *puVar63;
  ulong uVar64;
  uint8_t *puVar65;
  uint32_t *puVar66;
  uint uVar67;
  uint uVar68;
  undefined8 *puVar69;
  uint8_t *s1_orig_1;
  Command *pCVar70;
  undefined1 *puVar71;
  ulong uVar72;
  ulong uVar73;
  size_t sVar74;
  bool bVar75;
  ulong local_1a0;
  uint32_t *local_198;
  uint32_t *local_188;
  int local_174;
  ulong local_170;
  uint32_t *local_158;
  uint32_t *local_148;
  uint32_t *local_140;
  uint32_t *local_130;
  Command *local_100;
  uint32_t *local_e8;
  uint local_d4;
  uint8_t *s1_orig;
  uint8_t *s1_orig_4;
  ulong local_68;
  int last_distance;
  
  iVar40 = params->lgwin;
  sVar6 = params->stream_offset;
  puVar46 = (undefined1 *)*last_insert_len;
  puVar23 = (uint32_t *)((position - 7) + num_bytes);
  if (num_bytes < 8) {
    puVar23 = (uint32_t *)position;
  }
  lVar33 = 0x200;
  if (params->quality < 9) {
    lVar33 = 0x40;
  }
  puVar1 = (uint8_t *)(position + num_bytes);
  sVar7 = (params->dictionary).compound.total_size;
  iVar49 = (hasher->privat)._H6.num_last_distances_to_check_;
  if (4 < iVar49) {
    iVar57 = *dist_cache;
    dist_cache[4] = iVar57 + -1;
    dist_cache[5] = iVar57 + 1;
    dist_cache[6] = iVar57 + -2;
    dist_cache[7] = iVar57 + 2;
    *(ulong *)(dist_cache + 8) = CONCAT44(iVar57 + 3,iVar57 + -3);
    if (10 < iVar49) {
      iVar49 = dist_cache[1];
      dist_cache[10] = iVar49 + -1;
      dist_cache[0xb] = iVar49 + 1;
      dist_cache[0xc] = iVar49 + -2;
      dist_cache[0xd] = iVar49 + 2;
      *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar49 + 3,iVar49 + -3);
    }
  }
  if ((uint8_t *)(position + 8) < puVar1) {
    puVar3 = (uint32_t *)((1L << ((byte)iVar40 & 0x3f)) + -0x10);
    puVar47 = (uint8_t *)(lVar33 + position);
    puVar8 = (hasher->privat)._H5.buckets_;
    puVar9 = (hasher->privat)._H6.buckets_;
    lVar41 = sVar7 + 1;
    puVar24 = puVar1 + -7;
    local_100 = commands;
    local_148 = (uint32_t *)position;
    do {
      puVar66 = puVar3;
      if (local_148 < puVar3) {
        puVar66 = local_148;
      }
      puVar34 = (uint32_t *)((long)local_148 + sVar6);
      if (puVar3 <= (uint32_t *)((long)local_148 + sVar6)) {
        puVar34 = puVar3;
      }
      if ((params->dictionary).contextual.context_based == 0) {
        local_d4 = 0;
        local_68 = 0;
      }
      else {
        if (local_148 == (uint32_t *)0x0) {
          local_68 = 0;
        }
        else {
          local_68 = (ulong)ringbuffer[(ulong)((long)local_148 + -1) & ringbuffer_mask];
        }
        if (local_148 < (uint32_t *)0x2) {
          uVar58 = 0;
        }
        else {
          uVar58 = (ulong)ringbuffer[(ulong)((long)local_148 + -2) & ringbuffer_mask];
        }
        local_d4 = (uint)(params->dictionary).contextual.context_map
                         [literal_context_lut[uVar58 + 0x100] | literal_context_lut[local_68]];
      }
      local_140 = (uint32_t *)(puVar1 + -(long)local_148);
      pBVar10 = (params->dictionary).contextual.dict[local_d4];
      puVar31 = (uint8_t *)(params->dist).max_distance;
      uVar58 = (ulong)local_148 & ringbuffer_mask;
      uVar64 = (ulong)(hasher->privat)._H6.num_last_distances_to_check_;
      if (uVar64 == 0) {
        local_170 = 0x7e4;
        local_158 = (uint32_t *)0x0;
        local_188 = (uint32_t *)0x0;
        puVar44 = (uint32_t *)0x0;
      }
      else {
        local_170 = 0x7e4;
        puVar44 = (uint32_t *)0x0;
        uVar72 = 0;
        local_188 = (uint32_t *)0x0;
        local_158 = (uint32_t *)0x0;
        do {
          puVar25 = (uint32_t *)(long)dist_cache[uVar72];
          if (((puVar25 <= puVar66) && ((uint8_t *)((long)local_148 - (long)puVar25) < local_148))
             && ((uint8_t *)((long)puVar44 + uVar58) <= ringbuffer_mask)) {
            uVar35 = (ulong)((long)local_148 - (long)puVar25) & ringbuffer_mask;
            puVar42 = (uint8_t *)((long)puVar44 + uVar35);
            if ((puVar42 <= ringbuffer_mask) &&
               (ringbuffer[(long)((long)puVar44 + uVar58)] == ringbuffer[(long)puVar42])) {
              puVar36 = (ulong *)(ringbuffer + uVar35);
              puVar56 = local_140;
              puVar26 = (ulong *)(ringbuffer + uVar58);
              puVar55 = puVar36;
              for (puVar43 = local_140; (uint32_t *)0x7 < puVar43; puVar43 = puVar43 + -2) {
                uVar35 = *puVar26;
                uVar73 = *puVar55;
                if (uVar35 == uVar73) {
                  puVar55 = puVar55 + 1;
                }
                else {
                  uVar37 = 0;
                  if ((uVar73 ^ uVar35) != 0) {
                    for (; ((uVar73 ^ uVar35) >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                    }
                  }
                  puVar56 = (uint32_t *)
                            ((long)puVar55 + ((uVar37 >> 3 & 0x1fffffff) - (long)puVar36));
                }
                if (uVar35 != uVar73) goto LAB_01c0aabc;
                puVar26 = puVar26 + 1;
              }
              if (puVar43 != (uint32_t *)0x0) {
                puVar56 = (uint32_t *)0x0;
                do {
                  puVar63 = puVar56;
                  if (*(uint8_t *)((long)puVar55 + (long)puVar56) !=
                      *(uint8_t *)((long)puVar26 + (long)puVar56)) break;
                  puVar56 = (uint32_t *)((long)puVar56 + 1);
                  puVar63 = puVar43;
                } while (puVar43 != puVar56);
                puVar55 = (ulong *)((long)puVar55 + (long)puVar63);
              }
              puVar56 = (uint32_t *)((long)puVar55 - (long)puVar36);
LAB_01c0aabc:
              if ((((uint32_t *)0x2 < puVar56) || ((uVar72 < 2 && (puVar56 == (uint32_t *)0x2)))) &&
                 (uVar35 = (long)puVar56 * 0x87 + 0x78f, local_170 < uVar35)) {
                if (uVar72 != 0) {
                  uVar35 = uVar35 - ((0x1ca10U >> ((byte)uVar72 & 0xe) & 0xe) + 0x27);
                }
                if (local_170 < uVar35) {
                  puVar44 = puVar56;
                  local_188 = puVar56;
                  local_170 = uVar35;
                  local_158 = puVar25;
                }
              }
            }
          }
          uVar72 = uVar72 + 1;
        } while (uVar72 != uVar64);
      }
      uVar11 = (hasher->privat)._H6.hash_mul_;
      plVar2 = (long *)(ringbuffer + uVar58);
      uVar73 = *plVar2 * uVar11 >> 0x31;
      puVar26 = (ulong *)(ringbuffer + uVar58);
      uVar64 = (hasher->privat)._H5.block_size_;
      uVar4 = *(ushort *)((long)puVar8 + uVar73 * 2);
      uVar35 = (ulong)uVar4;
      uVar72 = 0;
      if (uVar64 <= uVar35) {
        uVar72 = uVar35 - uVar64;
      }
      pCVar70 = (Command *)(puVar9 + (uVar73 << (*(byte *)((long)&hasher->privat + 0x1c) & 0x3f)));
      do {
        if (uVar35 <= uVar72) break;
        uVar35 = uVar35 - 1;
        puVar25 = (uint32_t *)
                  ((long)local_148 -
                  (ulong)(&pCVar70->insert_len_)[(hasher->privat)._H6.block_mask_ & (uint)uVar35]);
        if ((puVar25 <= puVar66) && ((uint8_t *)((long)puVar44 + uVar58) <= ringbuffer_mask)) {
          uVar37 = (ulong)((&pCVar70->insert_len_)[(hasher->privat)._H6.block_mask_ & (uint)uVar35]
                          & (uint)ringbuffer_mask);
          if (((uint8_t *)((long)puVar44 + uVar37) <= ringbuffer_mask) &&
             ((ringbuffer[(long)((long)puVar44 + uVar58)] ==
               ringbuffer[(long)((long)puVar44 + uVar37)] &&
              ((int)*plVar2 == *(int *)(ringbuffer + uVar37))))) {
            puVar50 = (ulong *)(ringbuffer + uVar37 + 4);
            puVar55 = (ulong *)((long)plVar2 + 4);
            puVar36 = puVar50;
            puVar71 = puVar46;
            for (puVar42 = (uint8_t *)(local_140 + -1); (uint8_t *)0x7 < puVar42;
                puVar42 = puVar42 + -8) {
              uVar37 = *puVar55;
              uVar12 = *puVar36;
              if (uVar37 == uVar12) {
                puVar36 = puVar36 + 1;
              }
              else {
                uVar19 = 0;
                if ((uVar12 ^ uVar37) != 0) {
                  for (; ((uVar12 ^ uVar37) >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                  }
                }
                puVar71 = (undefined1 *)
                          ((long)puVar36 + ((uVar19 >> 3 & 0x1fffffff) - (long)puVar50));
              }
              if (uVar37 != uVar12) goto LAB_01c0acf5;
              puVar55 = puVar55 + 1;
            }
            if (puVar42 != (uint8_t *)0x0) {
              puVar65 = (uint8_t *)0x0;
              do {
                puVar61 = puVar65;
                if (*(uint8_t *)((long)puVar36 + (long)puVar65) !=
                    *(uint8_t *)((long)puVar55 + (long)puVar65)) break;
                puVar65 = puVar65 + 1;
                puVar61 = puVar42;
              } while (puVar42 != puVar65);
              puVar36 = (ulong *)((long)puVar36 + (long)puVar61);
            }
            puVar71 = (undefined1 *)((long)puVar36 - (long)puVar50);
LAB_01c0acf5:
            puVar43 = (uint32_t *)(puVar71 + 4);
            iVar40 = 0x1f;
            if ((uint)puVar25 != 0) {
              for (; (uint)puVar25 >> iVar40 == 0; iVar40 = iVar40 + -1) {
              }
            }
            uVar37 = (ulong)(iVar40 * -0x1e + 0x780) + (long)puVar43 * 0x87;
            if (local_170 < uVar37) {
              puVar44 = puVar43;
              local_188 = puVar43;
              local_170 = uVar37;
              local_158 = puVar25;
            }
          }
        }
      } while (puVar25 <= puVar66);
      (&pCVar70->insert_len_)[(hasher->privat)._H6.block_mask_ & (uint)uVar4] = (uint32_t)local_148;
      *(ushort *)((long)puVar8 + uVar73 * 2) = uVar4 + 1;
      if (local_170 == 0x7e4) {
        pHVar13 = (hasher->privat)._H6.common_;
        if (pHVar13->dict_num_matches < pHVar13->dict_num_lookups >> 7) {
          local_174 = 0;
        }
        else {
          puVar66 = (uint32_t *)(ulong)((uint)((int)*puVar26 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
          puVar42 = pBVar10->hash_table_lengths;
          sVar74 = pHVar13->dict_num_lookups;
          local_174 = 0;
          pCVar51 = (Command *)0x0;
          do {
            sVar74 = sVar74 + 1;
            pHVar13->dict_num_lookups = sVar74;
            bVar32 = puVar42[(long)puVar66];
            puVar65 = (uint8_t *)(ulong)bVar32;
            if (puVar65 != (uint8_t *)0x0) {
              bVar75 = true;
              if (puVar65 <= local_140) {
                pBVar16 = pBVar10->words;
                puVar36 = (ulong *)(pBVar16->data +
                                   (ulong)pBVar16->offsets_by_length[(long)puVar65] +
                                   (ulong)pBVar10->hash_table_words[(long)puVar66] * (long)puVar65);
                puVar55 = puVar26;
                puVar61 = puVar65;
                puVar44 = (uint32_t *)ringbuffer_mask;
                if (7 < bVar32) {
                  do {
                    uVar72 = *puVar36;
                    uVar35 = *puVar55;
                    if (uVar72 == uVar35) {
                      puVar55 = puVar55 + 1;
                    }
                    else {
                      uVar73 = 0;
                      if ((uVar35 ^ uVar72) != 0) {
                        for (; ((uVar35 ^ uVar72) >> uVar73 & 1) == 0; uVar73 = uVar73 + 1) {
                        }
                      }
                      puVar44 = (uint32_t *)
                                ((long)puVar55 + ((uVar73 >> 3 & 0x1fffffff) - (long)puVar26));
                    }
                    if (uVar72 != uVar35) goto LAB_01c0be79;
                    puVar36 = puVar36 + 1;
                    puVar61 = puVar61 + -8;
                  } while ((uint8_t *)0x7 < puVar61);
                }
                puVar50 = puVar55;
                if (puVar61 != (uint8_t *)0x0) {
                  puVar50 = (ulong *)((long)puVar55 + (long)puVar61);
                  lVar59 = 0;
                  do {
                    if (*(char *)((long)puVar55 + lVar59) != *(char *)((long)puVar36 + lVar59)) {
                      puVar50 = (ulong *)((long)puVar55 + lVar59);
                      break;
                    }
                    lVar59 = lVar59 + 1;
                  } while (puVar61 != (uint8_t *)lVar59);
                }
                puVar44 = (uint32_t *)((long)puVar50 - (long)puVar26);
LAB_01c0be79:
                if (((puVar44 != (uint32_t *)0x0) &&
                    (puVar65 < (uint8_t *)((long)puVar44 + (ulong)pBVar10->cutoffTransformsCount)))
                   && (puVar25 = (uint32_t *)
                                 ((long)puVar34 +
                                 ((ulong)((uint)(pBVar10->cutoffTransforms >>
                                                ((char)((long)puVar65 - (long)puVar44) * '\x06' &
                                                0x3fU)) & 0x3f) +
                                  ((long)puVar65 - (long)puVar44) * 4 <<
                                 (puVar65[(long)pBVar16] & 0x3f)) +
                                 (ulong)pBVar10->hash_table_words[(long)puVar66] + lVar41),
                      puVar25 <= puVar31)) {
                  iVar40 = 0x1f;
                  if ((uint)puVar25 != 0) {
                    for (; (uint)puVar25 >> iVar40 == 0; iVar40 = iVar40 + -1) {
                    }
                  }
                  uVar72 = ((long)puVar44 * 0x87 - (ulong)(uint)(iVar40 * 0x1e)) + 0x780;
                  if (local_170 <= uVar72) {
                    local_174 = (uint)bVar32 - (int)puVar44;
                    bVar75 = false;
                    local_188 = puVar44;
                    local_170 = uVar72;
                    local_158 = puVar25;
                  }
                }
              }
              if (!bVar75) {
                pHVar13->dict_num_matches = pHVar13->dict_num_matches + 1;
              }
            }
            pCVar70 = (Command *)((long)&pCVar51->insert_len_ + 1);
            puVar66 = (uint32_t *)((long)puVar66 + 1);
            bVar75 = pCVar51 == (Command *)0x0;
            pCVar51 = pCVar70;
          } while (bVar75);
        }
      }
      else {
        local_174 = 0;
      }
      sVar74 = (params->dictionary).compound.num_chunks;
      sVar14 = (params->dictionary).compound.total_size;
      local_e8 = local_188;
      if (sVar74 != 0) {
        sVar27 = 0;
        do {
          pPVar15 = (params->dictionary).compound.chunks[sVar27];
          bVar32 = (byte)pPVar15->bucket_bits;
          bVar54 = (byte)pPVar15->slot_bits;
          lVar59 = 1L << (bVar32 & 0x3f);
          bVar21 = -(char)pPVar15->hash_bits;
          uVar72 = ((*puVar26 << (bVar21 & 0x3f)) >> (bVar21 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
                   (-bVar32 & 0x3f);
          puVar66 = &pPVar15[1].magic + (1L << (bVar54 & 0x3f));
          bVar54 = -bVar54;
          puVar44 = (uint32_t *)((long)puVar66 + (ulong)pPVar15->num_items * 4 + lVar59 * 2);
          if (pPVar15->magic != 0xdebcede0) {
            puVar44 = *(uint32_t **)puVar44;
          }
          puVar42 = (uint8_t *)
                    ((long)puVar34 + (sVar14 - (params->dictionary).compound.chunk_offsets[sVar27]))
          ;
          uVar35 = (ulong)pPVar15->source_size;
          uVar4 = *(ushort *)((long)puVar66 + (uVar72 & 0xffffffff) * 2);
          puVar45 = (uint *)((long)puVar66 +
                            (ulong)((uint)uVar4 +
                                   (&pPVar15[1].magic)
                                   [(uint)((int)uVar72 << (bVar54 & 0x1f)) >> (bVar54 & 0x1f)]) * 4
                            + lVar59 * 2);
          lVar59 = 0;
          local_e8 = local_188;
          do {
            puVar25 = (uint32_t *)(long)dist_cache[lVar59];
            if ((puVar42 + -uVar35 < puVar25) &&
               (pCVar70 = (Command *)(puVar42 + -(long)puVar25), puVar25 <= puVar42)) {
              puVar66 = (uint32_t *)(uVar35 - (long)pCVar70);
              if (local_140 <= (uint32_t *)(uVar35 - (long)pCVar70)) {
                puVar66 = local_140;
              }
              pCVar70 = (Command *)((long)puVar44 + (long)&pCVar70->insert_len_);
              puVar55 = puVar26;
              pCVar51 = pCVar70;
              puVar43 = local_188;
              for (; (uint32_t *)0x7 < puVar66; puVar66 = puVar66 + -2) {
                uVar72 = *puVar55;
                uVar73._0_4_ = pCVar51->insert_len_;
                uVar73._4_4_ = pCVar51->copy_len_;
                if (uVar72 == uVar73) {
                  pCVar51 = (Command *)&pCVar51->dist_extra_;
                }
                else {
                  uVar37 = 0;
                  if ((uVar73 ^ uVar72) != 0) {
                    for (; ((uVar73 ^ uVar72) >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                    }
                  }
                  puVar43 = (uint32_t *)
                            ((long)pCVar51 + ((uVar37 >> 3 & 0x1fffffff) - (long)pCVar70));
                }
                if (uVar72 != uVar73) goto LAB_01c0af4d;
                puVar55 = puVar55 + 1;
              }
              pCVar52 = pCVar51;
              if (puVar66 != (uint32_t *)0x0) {
                pCVar52 = (Command *)((long)puVar66 + (long)&pCVar51->insert_len_);
                lVar60 = 0;
                do {
                  if (*(char *)(lVar60 + (long)&pCVar51->insert_len_) !=
                      *(char *)((long)puVar55 + lVar60)) {
                    pCVar52 = (Command *)(lVar60 + (long)&pCVar51->insert_len_);
                    break;
                  }
                  lVar60 = lVar60 + 1;
                } while (puVar66 != (uint32_t *)lVar60);
              }
              puVar43 = (uint32_t *)((long)pCVar52 - (long)pCVar70);
LAB_01c0af4d:
              if ((&DAT_00000001 < puVar43) &&
                 (uVar72 = (long)puVar43 * 0x87 + 0x78f, local_170 < uVar72)) {
                if (lVar59 != 0) {
                  uVar72 = uVar72 - ((0x1ca10U >> ((byte)lVar59 & 2) & 4) + 0x27);
                }
                if (local_170 < uVar72) {
                  if (local_188 < puVar43) {
                    local_188 = puVar43;
                  }
                  local_174 = 0;
                  local_170 = uVar72;
                  local_158 = puVar25;
                  local_e8 = puVar43;
                }
              }
            }
            lVar59 = lVar59 + 1;
          } while (lVar59 != 4);
          if (uVar4 != 0xffff) {
            do {
              uVar39 = *puVar45;
              uVar72 = (ulong)(uVar39 & 0x7fffffff);
              puVar43 = (uint32_t *)(puVar42 + -uVar72);
              puVar25 = (uint32_t *)(uVar35 - uVar72);
              if (local_140 <= (uint32_t *)(uVar35 - uVar72)) {
                puVar25 = local_140;
              }
              if ((((puVar43 <= puVar31) &&
                   ((uint8_t *)((long)local_188 + uVar58) <= ringbuffer_mask)) &&
                  (local_188 < puVar25)) &&
                 (puVar66 = puVar44,
                 ringbuffer[(long)((long)local_188 + uVar58)] ==
                 *(uint8_t *)((long)puVar44 + (long)((long)local_188 + uVar72)))) {
                puVar50 = (ulong *)((long)puVar44 + uVar72);
                puVar55 = puVar26;
                puVar36 = puVar50;
                for (; (uint32_t *)0x7 < puVar25; puVar25 = puVar25 + -2) {
                  uVar72 = *puVar55;
                  uVar73 = *puVar36;
                  if (uVar72 == uVar73) {
                    puVar36 = puVar36 + 1;
                  }
                  else {
                    uVar37 = 0;
                    if ((uVar73 ^ uVar72) != 0) {
                      for (; ((uVar73 ^ uVar72) >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                      }
                    }
                    pCVar70 = (Command *)((long)puVar36 - (long)puVar50);
                    puVar66 = (uint32_t *)((long)&pCVar70->insert_len_ + (uVar37 >> 3 & 0x1fffffff))
                    ;
                  }
                  if (uVar72 != uVar73) goto LAB_01c0b0c8;
                  puVar55 = puVar55 + 1;
                }
                puVar28 = puVar36;
                if (puVar25 != (uint32_t *)0x0) {
                  puVar28 = (ulong *)((long)puVar36 + (long)puVar25);
                  lVar59 = 0;
                  do {
                    if (*(char *)((long)puVar36 + lVar59) != *(char *)((long)puVar55 + lVar59)) {
                      puVar28 = (ulong *)((long)puVar36 + lVar59);
                      break;
                    }
                    lVar59 = lVar59 + 1;
                  } while (puVar25 != (uint32_t *)lVar59);
                }
                puVar66 = (uint32_t *)((long)puVar28 - (long)puVar50);
LAB_01c0b0c8:
                if ((uint32_t *)0x3 < puVar66) {
                  iVar40 = 0x1f;
                  if ((uint)puVar43 != 0) {
                    for (; (uint)puVar43 >> iVar40 == 0; iVar40 = iVar40 + -1) {
                    }
                  }
                  uVar72 = (ulong)(iVar40 * -0x1e + 0x780) + (long)puVar66 * 0x87;
                  if (local_170 < uVar72) {
                    local_174 = 0;
                    local_188 = puVar66;
                    local_170 = uVar72;
                    local_158 = puVar43;
                    local_e8 = puVar66;
                  }
                }
              }
              puVar45 = puVar45 + 1;
            } while (-1 < (int)uVar39);
          }
          sVar27 = sVar27 + 1;
          local_188 = local_e8;
        } while (sVar27 != sVar74);
      }
      if (local_170 < 0x7e5) {
        puVar46 = puVar46 + 1;
        position = (long)local_148 + 1;
        if (puVar47 < position) {
          if (puVar47 + (uint)((int)lVar33 * 4) < position) {
            puVar31 = (uint8_t *)((long)local_148 + 0x11);
            if (puVar24 <= (uint8_t *)((long)local_148 + 0x11)) {
              puVar31 = puVar24;
            }
            if (position < puVar31) {
              uVar39 = (hasher->privat)._H6.block_mask_;
              uVar5 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
              do {
                uVar58 = *(long *)(ringbuffer + (position & ringbuffer_mask)) * uVar11 >> 0x31;
                uVar4 = *(ushort *)((long)puVar8 + uVar58 * 2);
                *(ushort *)((long)puVar8 + uVar58 * 2) = uVar4 + 1;
                puVar9[(uVar58 << ((byte)uVar5 & 0x3f)) + (ulong)(uVar39 & uVar4)] =
                     (uint32_t)position;
                puVar46 = puVar46 + 4;
                position = position + 4;
              } while (position < puVar31);
            }
          }
          else {
            puVar31 = (uint8_t *)((long)local_148 + 9);
            if (puVar24 <= (uint8_t *)((long)local_148 + 9)) {
              puVar31 = puVar24;
            }
            if (position < puVar31) {
              uVar39 = (hasher->privat)._H6.block_mask_;
              uVar5 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
              do {
                uVar58 = *(long *)(ringbuffer + (position & ringbuffer_mask)) * uVar11 >> 0x31;
                uVar4 = *(ushort *)((long)puVar8 + uVar58 * 2);
                *(ushort *)((long)puVar8 + uVar58 * 2) = uVar4 + 1;
                puVar9[(uVar58 << ((byte)uVar5 & 0x3f)) + (ulong)(uVar39 & uVar4)] =
                     (uint32_t)position;
                puVar46 = puVar46 + 2;
                position = position + 2;
              } while (position < puVar31);
            }
          }
        }
      }
      else {
        iVar40 = (hasher->privat)._H6.num_last_distances_to_check_;
        uVar39 = (hasher->privat)._H6.block_mask_;
        uVar5 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
        iVar49 = 0;
        do {
          puVar34 = local_148;
          puVar47 = (uint8_t *)((long)local_140 + -1);
          puVar44 = (uint32_t *)((long)local_e8 + -1);
          if (puVar47 <= (uint8_t *)((long)local_e8 + -1)) {
            puVar44 = (uint32_t *)puVar47;
          }
          if (4 < params->quality) {
            puVar44 = (uint32_t *)0x0;
          }
          puVar42 = (uint8_t *)((long)local_148 + 1);
          puVar25 = puVar3;
          if (puVar42 < puVar3) {
            puVar25 = (uint32_t *)puVar42;
          }
          puVar43 = (uint32_t *)((long)local_148 + sVar6 + 1);
          if (puVar3 <= puVar43) {
            puVar43 = puVar3;
          }
          if ((params->dictionary).contextual.context_based != 0) {
            local_d4 = (uint)(params->dictionary).contextual.context_map
                             [literal_context_lut[local_68 + 0x100] |
                              literal_context_lut[ringbuffer[(ulong)local_148 & ringbuffer_mask]]];
            local_68 = (ulong)ringbuffer[(ulong)local_148 & ringbuffer_mask];
          }
          uVar58 = (ulong)puVar42 & ringbuffer_mask;
          pBVar10 = (params->dictionary).contextual.dict[local_d4];
          if (iVar40 == 0) {
            local_1a0 = 0x7e4;
            local_130 = (uint32_t *)0x0;
            local_198 = (uint32_t *)0x0;
          }
          else {
            local_1a0 = 0x7e4;
            uVar72 = 0;
            local_198 = (uint32_t *)0x0;
            local_130 = (uint32_t *)0x0;
            do {
              puVar56 = (uint32_t *)(long)dist_cache[uVar72];
              if (((puVar56 <= puVar25) && (puVar42 + -(long)puVar56 < puVar42)) &&
                 ((uint8_t *)((long)puVar44 + uVar58) <= ringbuffer_mask)) {
                uVar35 = (ulong)(puVar42 + -(long)puVar56) & ringbuffer_mask;
                puVar65 = (uint8_t *)((long)puVar44 + uVar35);
                if ((puVar65 <= ringbuffer_mask) &&
                   (ringbuffer[(long)((long)puVar44 + uVar58)] == ringbuffer[(long)puVar65])) {
                  puVar38 = ringbuffer + uVar35;
                  puVar63 = (uint32_t *)puVar47;
                  puVar65 = ringbuffer + uVar58;
                  puVar61 = puVar38;
                  for (puVar66 = (uint32_t *)puVar47; (uint32_t *)0x7 < puVar66;
                      puVar66 = puVar66 + -2) {
                    pCVar51 = *(Command **)puVar65;
                    pCVar70 = *(Command **)puVar61;
                    if (pCVar51 == pCVar70) {
                      puVar61 = puVar61 + 8;
                    }
                    else {
                      uVar35 = 0;
                      if (((ulong)pCVar70 ^ (ulong)pCVar51) != 0) {
                        for (; (((ulong)pCVar70 ^ (ulong)pCVar51) >> uVar35 & 1) == 0;
                            uVar35 = uVar35 + 1) {
                        }
                      }
                      puVar63 = (uint32_t *)(puVar61 + ((uVar35 >> 3 & 0x1fffffff) - (long)puVar38))
                      ;
                    }
                    if (pCVar51 != pCVar70) goto LAB_01c0b36e;
                    puVar65 = puVar65 + 8;
                  }
                  puVar62 = puVar61;
                  if (puVar66 != (uint32_t *)0x0) {
                    puVar62 = puVar61 + (long)puVar66;
                    lVar59 = 0;
                    do {
                      if (puVar61[lVar59] != puVar65[lVar59]) {
                        puVar62 = puVar61 + lVar59;
                        break;
                      }
                      lVar59 = lVar59 + 1;
                    } while (puVar66 != (uint32_t *)lVar59);
                  }
                  puVar63 = (uint32_t *)(puVar62 + -(long)puVar38);
LAB_01c0b36e:
                  if ((((uint32_t *)0x2 < puVar63) || ((uVar72 < 2 && (puVar63 == (uint32_t *)0x2)))
                      ) && (uVar35 = (long)puVar63 * 0x87 + 0x78f, local_1a0 < uVar35)) {
                    if (uVar72 != 0) {
                      uVar35 = uVar35 - ((0x1ca10U >> ((byte)uVar72 & 0xe) & 0xe) + 0x27);
                    }
                    if (local_1a0 < uVar35) {
                      puVar44 = puVar63;
                      local_1a0 = uVar35;
                      local_198 = puVar63;
                      local_130 = puVar56;
                    }
                  }
                }
              }
              uVar72 = uVar72 + 1;
            } while (uVar72 != (long)iVar40);
          }
          plVar2 = (long *)(ringbuffer + uVar58);
          uVar35 = *plVar2 * uVar11 >> 0x31;
          lVar59 = uVar35 << ((byte)uVar5 & 0x3f);
          puVar26 = (ulong *)(ringbuffer + uVar58);
          uVar4 = *(ushort *)((long)puVar8 + uVar35 * 2);
          uVar73 = (ulong)uVar4;
          uVar72 = 0;
          if (uVar64 <= uVar73) {
            uVar72 = uVar73 - uVar64;
          }
          do {
            if (uVar73 <= uVar72) break;
            uVar73 = uVar73 - 1;
            puVar66 = (uint32_t *)
                      (puVar42 +
                      -(ulong)puVar9[lVar59 + (ulong)((hasher->privat)._H6.block_mask_ &
                                                     (uint)uVar73)]);
            if ((puVar66 <= puVar25) && ((uint8_t *)((long)puVar44 + uVar58) <= ringbuffer_mask)) {
              uVar37 = (ulong)(puVar9[lVar59 + (ulong)((hasher->privat)._H6.block_mask_ &
                                                      (uint)uVar73)] & (uint)ringbuffer_mask);
              if (((uint8_t *)((long)puVar44 + uVar37) <= ringbuffer_mask) &&
                 ((ringbuffer[(long)((long)puVar44 + uVar58)] ==
                   ringbuffer[(long)((long)puVar44 + uVar37)] &&
                  ((int)*plVar2 == *(int *)(ringbuffer + uVar37))))) {
                puVar50 = (ulong *)(ringbuffer + uVar37 + 4);
                puVar55 = (ulong *)((long)plVar2 + 4);
                puVar36 = puVar50;
                for (puVar65 = (uint8_t *)((long)local_140 + -5); (uint8_t *)0x7 < puVar65;
                    puVar65 = puVar65 + -8) {
                  uVar37 = *puVar55;
                  uVar12 = *puVar36;
                  if (uVar37 == uVar12) {
                    puVar36 = puVar36 + 1;
                  }
                  else {
                    uVar19 = 0;
                    if ((uVar12 ^ uVar37) != 0) {
                      for (; ((uVar12 ^ uVar37) >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                      }
                    }
                    pCVar70 = (Command *)
                              ((long)puVar36 + ((uVar19 >> 3 & 0x1fffffff) - (long)puVar50));
                  }
                  if (uVar37 != uVar12) goto LAB_01c0b578;
                  puVar55 = puVar55 + 1;
                }
                puVar28 = puVar36;
                if (puVar65 != (uint8_t *)0x0) {
                  puVar28 = (ulong *)((long)puVar36 + (long)puVar65);
                  puVar61 = (uint8_t *)0x0;
                  do {
                    if (*(uint8_t *)((long)puVar36 + (long)puVar61) !=
                        *(uint8_t *)((long)puVar55 + (long)puVar61)) {
                      puVar28 = (ulong *)((long)puVar36 + (long)puVar61);
                      break;
                    }
                    puVar61 = puVar61 + 1;
                  } while (puVar65 != puVar61);
                }
                pCVar70 = (Command *)((long)puVar28 - (long)puVar50);
LAB_01c0b578:
                pCVar70 = (Command *)&pCVar70->copy_len_;
                iVar57 = 0x1f;
                if ((uint)puVar66 != 0) {
                  for (; (uint)puVar66 >> iVar57 == 0; iVar57 = iVar57 + -1) {
                  }
                }
                uVar37 = (ulong)(iVar57 * -0x1e + 0x780) + (long)pCVar70 * 0x87;
                if (local_1a0 < uVar37) {
                  puVar44 = (uint32_t *)pCVar70;
                  local_1a0 = uVar37;
                  local_198 = (uint32_t *)pCVar70;
                  local_130 = puVar66;
                }
              }
            }
          } while (puVar66 <= puVar25);
          puVar9[lVar59 + (ulong)(uVar39 & uVar4)] = (uint32_t)puVar42;
          *(ushort *)((long)puVar8 + uVar35 * 2) = uVar4 + 1;
          local_188 = local_198;
          if (local_1a0 == 0x7e4) {
            pHVar13 = (hasher->privat)._H6.common_;
            if (pHVar13->dict_num_matches < pHVar13->dict_num_lookups >> 7) {
              iVar57 = 0;
            }
            else {
              uVar72 = (ulong)((uint)((int)*puVar26 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
              puVar66 = (uint32_t *)pBVar10->hash_table_lengths;
              sVar27 = pHVar13->dict_num_lookups;
              iVar57 = 0;
              lVar59 = 0;
              do {
                sVar27 = sVar27 + 1;
                pHVar13->dict_num_lookups = sVar27;
                bVar32 = *(byte *)((long)puVar66 + uVar72);
                puVar65 = (uint8_t *)(ulong)bVar32;
                if (puVar65 != (uint8_t *)0x0) {
                  bVar75 = true;
                  if (puVar65 <= puVar47) {
                    pBVar16 = pBVar10->words;
                    puVar36 = (ulong *)(pBVar16->data +
                                       (ulong)pBVar16->offsets_by_length[(long)puVar65] +
                                       (ulong)pBVar10->hash_table_words[uVar72] * (long)puVar65);
                    puVar61 = puVar65;
                    puVar55 = puVar26;
                    puVar44 = (uint32_t *)ringbuffer_mask;
                    if (7 < bVar32) {
                      do {
                        uVar35 = *puVar36;
                        uVar73 = *puVar55;
                        if (uVar35 == uVar73) {
                          puVar55 = puVar55 + 1;
                        }
                        else {
                          uVar37 = 0;
                          if ((uVar73 ^ uVar35) != 0) {
                            for (; ((uVar73 ^ uVar35) >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                            }
                          }
                          puVar44 = (uint32_t *)
                                    ((long)puVar55 + ((uVar37 >> 3 & 0x1fffffff) - (long)puVar26));
                        }
                        if (uVar35 != uVar73) goto LAB_01c0bb52;
                        puVar36 = puVar36 + 1;
                        puVar61 = puVar61 + -8;
                      } while ((uint8_t *)0x7 < puVar61);
                    }
                    puVar50 = puVar55;
                    if (puVar61 != (uint8_t *)0x0) {
                      puVar50 = (ulong *)((long)puVar55 + (long)puVar61);
                      lVar60 = 0;
                      do {
                        if (*(char *)((long)puVar55 + lVar60) != *(char *)((long)puVar36 + lVar60))
                        {
                          puVar50 = (ulong *)((long)puVar55 + lVar60);
                          break;
                        }
                        lVar60 = lVar60 + 1;
                      } while (puVar61 != (uint8_t *)lVar60);
                    }
                    puVar44 = (uint32_t *)((long)puVar50 - (long)puVar26);
LAB_01c0bb52:
                    if (((puVar44 != (uint32_t *)0x0) &&
                        (puVar65 < (uint8_t *)
                                   ((long)puVar44 + (ulong)pBVar10->cutoffTransformsCount))) &&
                       (puVar25 = (uint32_t *)
                                  ((long)puVar43 +
                                  ((ulong)((uint)(pBVar10->cutoffTransforms >>
                                                 ((char)((long)puVar65 - (long)puVar44) * '\x06' &
                                                 0x3fU)) & 0x3f) +
                                   ((long)puVar65 - (long)puVar44) * 4 <<
                                  (puVar65[(long)pBVar16] & 0x3f)) +
                                  (ulong)pBVar10->hash_table_words[uVar72] + lVar41),
                       puVar25 <= puVar31)) {
                      iVar20 = 0x1f;
                      if ((uint)puVar25 != 0) {
                        for (; (uint)puVar25 >> iVar20 == 0; iVar20 = iVar20 + -1) {
                        }
                      }
                      uVar35 = ((long)puVar44 * 0x87 - (ulong)(uint)(iVar20 * 0x1e)) + 0x780;
                      if (local_1a0 <= uVar35) {
                        iVar57 = (uint)bVar32 - (int)puVar44;
                        bVar75 = false;
                        local_198 = puVar44;
                        local_1a0 = uVar35;
                        local_130 = puVar25;
                      }
                    }
                  }
                  if (!bVar75) {
                    pHVar13->dict_num_matches = pHVar13->dict_num_matches + 1;
                  }
                }
                uVar72 = uVar72 + 1;
                bVar75 = lVar59 == 0;
                lVar59 = lVar59 + 1;
                local_188 = local_198;
              } while (bVar75);
            }
          }
          else {
            iVar57 = 0;
          }
          if (sVar74 != 0) {
            sVar27 = 0;
            do {
              pPVar15 = (params->dictionary).compound.chunks[sVar27];
              bVar32 = (byte)pPVar15->bucket_bits;
              bVar54 = (byte)pPVar15->slot_bits;
              bVar21 = -(char)pPVar15->hash_bits;
              uVar72 = ((*puVar26 << (bVar21 & 0x3f)) >> (bVar21 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
                       (-bVar32 & 0x3f);
              lVar59 = (1L << (bVar54 & 0x3f)) * 4;
              lVar60 = (1L << (bVar32 & 0x3f)) * 2;
              bVar54 = -bVar54;
              puVar66 = (uint32_t *)CONCAT71((int7)((ulong)puVar66 >> 8),bVar54);
              puVar69 = (undefined8 *)
                        ((long)&pPVar15[1].magic + (ulong)pPVar15->num_items * 4 + lVar60 + lVar59);
              if (pPVar15->magic != 0xdebcede0) {
                puVar69 = (undefined8 *)*puVar69;
              }
              puVar65 = (uint8_t *)
                        ((long)puVar43 +
                        (sVar14 - (params->dictionary).compound.chunk_offsets[sVar27]));
              uVar35 = (ulong)pPVar15->source_size;
              uVar4 = *(ushort *)((long)&pPVar15[1].magic + (uVar72 & 0xffffffff) * 2 + lVar59);
              puVar45 = (uint *)((long)&pPVar15[1].magic +
                                (ulong)((uint)uVar4 +
                                       (&pPVar15[1].magic)
                                       [(uint)((int)uVar72 << (bVar54 & 0x1f)) >> (bVar54 & 0x1f)])
                                * 4 + lVar60 + lVar59);
              lVar59 = 0;
              local_198 = local_188;
              do {
                puVar44 = (uint32_t *)(long)dist_cache[lVar59];
                if ((puVar65 + -uVar35 < puVar44) && (puVar44 <= puVar65)) {
                  puVar61 = (uint8_t *)(uVar35 - ((long)puVar65 - (long)puVar44));
                  if (puVar47 <= puVar61) {
                    puVar61 = puVar47;
                  }
                  puVar50 = (ulong *)(((long)puVar65 - (long)puVar44) + (long)puVar69);
                  puVar55 = puVar26;
                  puVar36 = puVar50;
                  for (; (uint8_t *)0x7 < puVar61; puVar61 = puVar61 + -8) {
                    uVar72 = *puVar55;
                    uVar73 = *puVar36;
                    if (uVar72 == uVar73) {
                      puVar36 = puVar36 + 1;
                    }
                    else {
                      uVar37 = 0;
                      if ((uVar73 ^ uVar72) != 0) {
                        for (; ((uVar73 ^ uVar72) >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                        }
                      }
                      puVar66 = (uint32_t *)
                                ((long)puVar36 + ((uVar37 >> 3 & 0x1fffffff) - (long)puVar50));
                    }
                    if (uVar72 != uVar73) goto LAB_01c0b7dc;
                    puVar55 = puVar55 + 1;
                  }
                  puVar28 = puVar36;
                  if (puVar61 != (uint8_t *)0x0) {
                    puVar28 = (ulong *)((long)puVar36 + (long)puVar61);
                    lVar60 = 0;
                    do {
                      if (*(char *)((long)puVar36 + lVar60) != *(char *)((long)puVar55 + lVar60)) {
                        puVar28 = (ulong *)((long)puVar36 + lVar60);
                        break;
                      }
                      lVar60 = lVar60 + 1;
                    } while (puVar61 != (uint8_t *)lVar60);
                  }
                  puVar66 = (uint32_t *)((long)puVar28 - (long)puVar50);
LAB_01c0b7dc:
                  if ((&DAT_00000001 < puVar66) &&
                     (uVar72 = (long)puVar66 * 0x87 + 0x78f, local_1a0 < uVar72)) {
                    if (lVar59 != 0) {
                      uVar72 = uVar72 - ((0x1ca10U >> ((byte)lVar59 & 2) & 4) + 0x27);
                    }
                    if (local_1a0 < uVar72) {
                      if (local_198 < puVar66) {
                        local_198 = puVar66;
                      }
                      iVar57 = 0;
                      local_1a0 = uVar72;
                      local_188 = puVar66;
                      local_130 = puVar44;
                    }
                  }
                }
                lVar59 = lVar59 + 1;
              } while (lVar59 != 4);
              if (uVar4 != 0xffff) {
                do {
                  uVar67 = *puVar45;
                  uVar72 = (ulong)(uVar67 & 0x7fffffff);
                  puVar44 = (uint32_t *)(puVar65 + -uVar72);
                  puVar61 = (uint8_t *)(uVar35 - uVar72);
                  if (puVar47 <= (uint8_t *)(uVar35 - uVar72)) {
                    puVar61 = puVar47;
                  }
                  if ((((puVar44 <= puVar31) &&
                       ((uint8_t *)((long)local_198 + uVar58) <= ringbuffer_mask)) &&
                      (local_198 < puVar61)) &&
                     (ringbuffer[(long)((long)local_198 + uVar58)] ==
                      *(uint8_t *)((long)puVar69 + (long)((long)local_198 + uVar72)))) {
                    puVar53 = (undefined8 *)(uVar72 + (long)puVar69);
                    puVar55 = puVar26;
                    puVar29 = puVar53;
                    puVar25 = local_198;
                    for (; (uint8_t *)0x7 < puVar61; puVar61 = puVar61 + -8) {
                      puVar66 = (uint32_t *)*puVar55;
                      puVar38 = (uint8_t *)*puVar29;
                      if (puVar66 == (uint32_t *)puVar38) {
                        puVar29 = puVar29 + 1;
                      }
                      else {
                        uVar72 = 0;
                        if (((ulong)puVar38 ^ (ulong)puVar66) != 0) {
                          for (; (((ulong)puVar38 ^ (ulong)puVar66) >> uVar72 & 1) == 0;
                              uVar72 = uVar72 + 1) {
                          }
                        }
                        puVar25 = (uint32_t *)
                                  ((long)puVar29 + ((uVar72 >> 3 & 0x1fffffff) - (long)puVar53));
                      }
                      if (puVar66 != (uint32_t *)puVar38) goto LAB_01c0b94d;
                      puVar55 = puVar55 + 1;
                    }
                    puVar30 = puVar29;
                    if (puVar61 != (uint8_t *)0x0) {
                      puVar30 = (undefined8 *)((long)puVar29 + (long)puVar61);
                      puVar66 = (uint32_t *)0x0;
                      do {
                        if (*(uint8_t *)((long)puVar29 + (long)puVar66) !=
                            *(uint8_t *)((long)puVar55 + (long)puVar66)) {
                          puVar30 = (undefined8 *)((long)puVar29 + (long)puVar66);
                          break;
                        }
                        puVar66 = (uint32_t *)((long)puVar66 + 1);
                      } while ((uint32_t *)puVar61 != puVar66);
                    }
                    puVar25 = (uint32_t *)((long)puVar30 - (long)puVar53);
LAB_01c0b94d:
                    if ((uint32_t *)0x3 < puVar25) {
                      iVar20 = 0x1f;
                      if ((uint)puVar44 != 0) {
                        for (; (uint)puVar44 >> iVar20 == 0; iVar20 = iVar20 + -1) {
                        }
                      }
                      uVar72 = (ulong)(iVar20 * -0x1e + 0x780) + (long)puVar25 * 0x87;
                      if (local_1a0 < uVar72) {
                        iVar57 = 0;
                        local_1a0 = uVar72;
                        local_198 = puVar25;
                        local_188 = puVar25;
                        local_130 = puVar44;
                      }
                    }
                  }
                  puVar45 = puVar45 + 1;
                } while (-1 < (int)uVar67);
              }
              sVar27 = sVar27 + 1;
            } while (sVar27 != sVar74);
          }
          bVar75 = local_170 + 0xaf <= local_1a0;
          iVar20 = iVar49;
          if (bVar75) {
            puVar46 = puVar46 + 1;
            local_170 = local_1a0;
            local_158 = local_130;
            local_e8 = local_188;
            local_174 = iVar57;
            local_148 = (uint32_t *)puVar42;
            iVar20 = iVar49 + 1;
          }
          bVar18 = iVar49 < 3;
          pCVar70 = commands;
          local_140 = (uint32_t *)puVar47;
          iVar49 = iVar20;
        } while (bVar75 && (bVar18 && (uint8_t *)((long)puVar34 + 9) < puVar1));
        puVar66 = (uint32_t *)((long)local_148 + sVar6);
        if (puVar3 <= (uint32_t *)((long)local_148 + sVar6)) {
          puVar66 = puVar3;
        }
        puVar47 = (uint8_t *)((long)puVar66 + sVar7);
        if (puVar47 < local_158) {
LAB_01c0c035:
          puVar31 = (uint8_t *)((long)local_158 + 0xf);
        }
        else {
          uVar39 = 0;
          bVar75 = false;
          if (local_158 != (uint32_t *)(long)*dist_cache) {
            if (local_158 == (uint32_t *)(long)dist_cache[1]) {
              uVar39 = 1;
            }
            else {
              puVar31 = (uint8_t *)((long)local_158 + (3 - (long)(long)*dist_cache));
              if (puVar31 < (uint8_t *)0x7) {
                bVar32 = (byte)((int)puVar31 << 2);
                uVar39 = 0x9750468;
              }
              else {
                puVar31 = (uint8_t *)((long)local_158 + (3 - (long)(long)dist_cache[1]));
                if ((uint8_t *)0x6 < puVar31) {
                  if (local_158 != (uint32_t *)(long)dist_cache[2]) {
                    bVar75 = local_158 != (uint32_t *)(long)dist_cache[3];
                    uVar39 = 3;
                    goto LAB_01c0c02c;
                  }
                  uVar39 = 2;
                  goto LAB_01c0c02a;
                }
                bVar32 = (byte)((int)puVar31 << 2);
                uVar39 = 0xfdb1ace;
              }
              uVar39 = uVar39 >> (bVar32 & 0x1f) & 0xf;
            }
LAB_01c0c02a:
            bVar75 = false;
          }
LAB_01c0c02c:
          if (bVar75) goto LAB_01c0c035;
          puVar31 = (uint8_t *)(ulong)uVar39;
        }
        if ((local_158 <= puVar47) && (puVar31 != (uint8_t *)0x0)) {
          dist_cache[3] = dist_cache[2];
          uVar17 = *(undefined8 *)dist_cache;
          *(undefined8 *)(dist_cache + 1) = uVar17;
          iVar49 = (int)local_158;
          *dist_cache = iVar49;
          iVar40 = (hasher->privat)._H6.num_last_distances_to_check_;
          if (4 < iVar40) {
            dist_cache[4] = iVar49 + -1;
            dist_cache[5] = iVar49 + 1;
            dist_cache[6] = iVar49 + -2;
            dist_cache[7] = iVar49 + 2;
            dist_cache[8] = iVar49 + -3;
            dist_cache[9] = iVar49 + 3;
            if (10 < iVar40) {
              iVar40 = (int)uVar17;
              dist_cache[10] = iVar40 + -1;
              dist_cache[0xb] = iVar40 + 1;
              dist_cache[0xc] = iVar40 + -2;
              dist_cache[0xd] = iVar40 + 2;
              *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar40 + 3,iVar40 + -3);
            }
          }
        }
        uVar39 = (uint)puVar46;
        local_100->insert_len_ = uVar39;
        local_100->copy_len_ = local_174 << 0x19 | (uint)local_e8;
        uVar58 = (ulong)(params->dist).num_direct_distance_codes;
        puVar47 = (uint8_t *)(uVar58 + 0x10);
        if (puVar31 < puVar47) {
          local_100->dist_prefix_ = (uint16_t)puVar31;
          uVar22 = 0;
        }
        else {
          uVar22 = (params->dist).distance_postfix_bits;
          bVar32 = (byte)uVar22;
          puVar31 = puVar31 + ((4L << (bVar32 & 0x3f)) - uVar58) + -0x10;
          uVar67 = 0x1f;
          if ((uint)puVar31 != 0) {
            for (; (uint)puVar31 >> uVar67 == 0; uVar67 = uVar67 - 1) {
            }
          }
          uVar67 = (uVar67 ^ 0xffffffe0) + 0x1f;
          bVar75 = ((ulong)puVar31 >> ((ulong)uVar67 & 0x3f) & 1) != 0;
          iVar40 = uVar67 - uVar22;
          local_100->dist_prefix_ =
               (short)((uint)bVar75 + iVar40 * 2 + 0xfffe << (bVar32 & 0x3f)) +
               (short)puVar47 + (~(ushort)(-1 << (bVar32 & 0x1f)) & (ushort)puVar31) |
               (short)iVar40 * 0x400;
          uVar22 = (uint32_t)
                   ((long)puVar31 - ((ulong)bVar75 + 2 << ((byte)uVar67 & 0x3f)) >> (bVar32 & 0x3f))
          ;
        }
        local_100->dist_extra_ = uVar22;
        if ((undefined1 *)0x5 < puVar46) {
          if (puVar46 < (undefined1 *)0x82) {
            uVar39 = 0x1f;
            uVar67 = (uint)(puVar46 + -2);
            if (uVar67 != 0) {
              for (; uVar67 >> uVar39 == 0; uVar39 = uVar39 - 1) {
              }
            }
            uVar39 = (int)((ulong)(puVar46 + -2) >> ((char)(uVar39 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar39 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (puVar46 < (undefined1 *)0x842) {
            uVar67 = 0x1f;
            if (uVar39 - 0x42 != 0) {
              for (; uVar39 - 0x42 >> uVar67 == 0; uVar67 = uVar67 - 1) {
              }
            }
            uVar39 = (uVar67 ^ 0xffe0) + 0x2a;
          }
          else {
            uVar39 = 0x15;
            if ((undefined1 *)0x1841 < puVar46) {
              uVar39 = (uint)(ushort)(0x17 - (puVar46 < (undefined1 *)0x5842));
            }
          }
        }
        uVar67 = local_174 + (uint)local_e8;
        if (uVar67 < 10) {
          uVar68 = uVar67 - 2;
        }
        else if (uVar67 < 0x86) {
          uVar67 = uVar67 - 6;
          uVar68 = 0x1f;
          if (uVar67 != 0) {
            for (; uVar67 >> uVar68 == 0; uVar68 = uVar68 - 1) {
            }
          }
          uVar68 = (int)((ulong)(long)(int)uVar67 >> ((char)(uVar68 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar68 ^ 0xffffffe0) * 2 + 0x42;
        }
        else {
          uVar68 = 0x17;
          if (uVar67 < 0x846) {
            uVar68 = 0x1f;
            if (uVar67 - 0x46 != 0) {
              for (; uVar67 - 0x46 >> uVar68 == 0; uVar68 = uVar68 - 1) {
              }
            }
            uVar68 = (uVar68 ^ 0xffe0) + 0x2c;
          }
        }
        uVar4 = (ushort)uVar68;
        uVar48 = (uVar4 & 7) + ((ushort)uVar39 & 7) * 8;
        if ((((local_100->dist_prefix_ & 0x3ff) == 0) && ((ushort)uVar39 < 8)) && (uVar4 < 0x10)) {
          if (7 < uVar4) {
            uVar48 = uVar48 + 0x40;
          }
        }
        else {
          iVar40 = ((uVar39 & 0xffff) >> 3) * 3 + ((uVar68 & 0xffff) >> 3);
          uVar48 = uVar48 + ((ushort)(0x520d40 >> ((char)iVar40 * '\x02' & 0x1fU)) & 0xc0) +
                            (short)iVar40 * 0x40 + 0x40;
        }
        local_100->cmd_prefix_ = uVar48;
        *num_literals = (size_t)(puVar46 + *num_literals);
        position = (long)local_e8 + (long)local_148;
        puVar66 = puVar23;
        if (position < puVar23) {
          puVar66 = (uint32_t *)position;
        }
        puVar34 = (uint32_t *)((long)local_148 + 2);
        if (local_158 < (uint8_t *)((ulong)local_e8 >> 2)) {
          puVar44 = (uint32_t *)(position + -(long)local_158 * 4);
          if ((uint32_t *)(position + -(long)local_158 * 4) < puVar34) {
            puVar44 = puVar34;
          }
          puVar34 = puVar44;
          if (puVar66 < puVar44) {
            puVar34 = puVar66;
          }
        }
        puVar47 = (uint8_t *)((long)local_148 + lVar33 + (long)local_e8 * 2);
        local_100 = local_100 + 1;
        if (puVar34 < puVar66) {
          uVar11 = (hasher->privat)._H6.hash_mul_;
          uVar39 = (hasher->privat)._H6.block_mask_;
          uVar5 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
          do {
            uVar58 = *(long *)(ringbuffer + ((ulong)puVar34 & ringbuffer_mask)) * uVar11 >> 0x31;
            uVar4 = *(ushort *)((long)puVar8 + uVar58 * 2);
            *(ushort *)((long)puVar8 + uVar58 * 2) = uVar4 + 1;
            puVar9[(uVar58 << ((byte)uVar5 & 0x3f)) + (ulong)(uVar39 & uVar4)] = (uint32_t)puVar34;
            puVar34 = (uint32_t *)((long)puVar34 + 1);
          } while (puVar66 != puVar34);
          puVar46 = (undefined1 *)0x0;
        }
        else {
          puVar46 = (undefined1 *)0x0;
        }
      }
      local_148 = (uint32_t *)position;
    } while ((uint32_t *)(position + 8) < puVar1);
  }
  else {
    local_100 = commands;
  }
  *last_insert_len = (size_t)(puVar1 + ((long)puVar46 - position));
  *num_commands = *num_commands + ((long)local_100 - (long)commands >> 4);
  return;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}